

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaL_addvalue(luaL_Buffer *B)

{
  int iVar1;
  char *__src;
  char *s;
  size_t vl;
  lua_State *L;
  luaL_Buffer *B_local;
  
  vl = (size_t)B->L;
  L = (lua_State *)B;
  __src = lua_tolstring((lua_State *)vl,-1,(size_t *)&s);
  if ((char *)(0x2000U - ((long)L->next - (long)&L->base)) < s) {
    iVar1 = emptybuffer((luaL_Buffer *)L);
    if (iVar1 != 0) {
      lua_insert((lua_State *)vl,-2);
    }
    *(int *)&L->tt = *(int *)&L->tt + 1;
    adjuststack((luaL_Buffer *)L);
  }
  else {
    memcpy(L->next,__src,(size_t)s);
    L->next = (GCObject *)(s + (long)L->next);
    lua_settop((lua_State *)vl,-2);
  }
  return;
}

Assistant:

static void luaL_addvalue(luaL_Buffer*B){
lua_State*L=B->L;
size_t vl;
const char*s=lua_tolstring(L,-1,&vl);
if(vl<=bufffree(B)){
memcpy(B->p,s,vl);
B->p+=vl;
lua_pop(L,1);
}
else{
if(emptybuffer(B))
lua_insert(L,-2);
B->lvl++;
adjuststack(B);
}
}